

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

bool __thiscall GrcSymbolTableEntry::IsMovement(GrcSymbolTableEntry *this)

{
  int iVar1;
  
  do {
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 == 0) {
      return true;
    }
    this = this->m_psymtbl->m_psymParent;
  } while (this != (Symbol)0x0);
  return false;
}

Assistant:

bool GrcSymbolTableEntry::IsMovement()
{
	if (m_staFieldName == "shift")
		return true;
	if (m_staFieldName == "kern")
		return true;
	if (m_staFieldName == "advance")
		return true;
	Symbol psymParent = ParentSymbol();
	if (!psymParent)
		return false;
	return (psymParent->IsMovement());
}